

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:236:23)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:236:23)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> *pEVar1;
  Maybe<unsigned_long> *t;
  Type *func;
  Maybe<capnp::MessageReaderAndFds> local_5b0;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> local_588;
  Maybe<unsigned_long> *local_3c0;
  Maybe<unsigned_long> *depValue;
  Maybe<unsigned_long> *_depValue779;
  Exception *local_1e8;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1c8 [8];
  ExceptionOr<kj::Maybe<unsigned_long>_> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:236:23)>
  *this_local;
  
  depResult.value.ptr.field_1.value.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)output;
  ExceptionOr<kj::Maybe<unsigned_long>_>::ExceptionOr
            ((ExceptionOr<kj::Maybe<unsigned_long>_> *)local_1c8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1c8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1c8);
  if (depException == (Exception *)0x0) {
    t = readMaybe<kj::Maybe<unsigned_long>>
                  ((Maybe<kj::Maybe<unsigned_long>_> *)
                   ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.
                           builder + 0x18));
    depValue = t;
    if (t != (Maybe<unsigned_long> *)0x0) {
      local_3c0 = t;
      func = (Type *)mv<kj::Maybe<unsigned_long>>(t);
      MaybeVoidCaller<kj::Maybe<unsigned_long>,kj::Maybe<capnp::MessageReaderAndFds>>::
      apply<capnp::tryReadMessage(kj::AsyncCapabilityStream&,kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>
                (&local_5b0,
                 (MaybeVoidCaller<kj::Maybe<unsigned_long>,kj::Maybe<capnp::MessageReaderAndFds>> *)
                 &this->func,func,t);
      TransformPromiseNodeBase::handle<kj::Maybe<capnp::MessageReaderAndFds>>
                (&local_588,&this->super_TransformPromiseNodeBase,&local_5b0);
      pEVar1 = ExceptionOrValue::as<kj::Maybe<capnp::MessageReaderAndFds>>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.ptr.field_1);
      ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::operator=(pEVar1,&local_588);
      ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::~ExceptionOr(&local_588);
      Maybe<capnp::MessageReaderAndFds>::~Maybe(&local_5b0);
    }
  }
  else {
    local_1e8 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::ExceptionOr
              ((ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> *)&_depValue779,false,exception)
    ;
    pEVar1 = ExceptionOrValue::as<kj::Maybe<capnp::MessageReaderAndFds>>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.ptr.field_1);
    ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::operator=
              (pEVar1,(ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> *)&_depValue779);
    ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::~ExceptionOr
              ((ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> *)&_depValue779);
  }
  ExceptionOr<kj::Maybe<unsigned_long>_>::~ExceptionOr
            ((ExceptionOr<kj::Maybe<unsigned_long>_> *)local_1c8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }